

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

string * to_string_abi_cxx11_(ze_command_queue_priority_t priority)

{
  int in_ESI;
  undefined4 in_register_0000003c;
  string *this;
  __cxx11 local_48 [34];
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [5];
  string *psStack_10;
  ze_command_queue_priority_t priority_local;
  
  this = (string *)CONCAT44(in_register_0000003c,priority);
  psStack_10 = this;
  if (in_ESI == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_PRIORITY_NORMAL",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_ESI == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_PRIORITY_LOW",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_ESI == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(this,"ZE_COMMAND_QUEUE_PRIORITY_HIGH",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::__cxx11::to_string(local_48,in_ESI);
    std::operator+((char *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Unknown ze_command_queue_priority_t value: ");
    std::__cxx11::string::~string((string *)local_48);
  }
  return this;
}

Assistant:

std::string to_string(const ze_command_queue_priority_t priority) {
  if (priority == ZE_COMMAND_QUEUE_PRIORITY_NORMAL) {
    return "ZE_COMMAND_QUEUE_PRIORITY_NORMAL";
  } else if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_LOW) {
    return "ZE_COMMAND_QUEUE_PRIORITY_LOW";
  } else if (priority == ZE_COMMAND_QUEUE_PRIORITY_PRIORITY_HIGH) {
    return "ZE_COMMAND_QUEUE_PRIORITY_HIGH";
  } else {
    return "Unknown ze_command_queue_priority_t value: " +
           std::to_string(static_cast<int>(priority));
  }
}